

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::connection::cgi_forwarder::write_post(cgi_forwarder *this)

{
  size_type __new_size;
  element_type *peVar1;
  pointer pcVar2;
  long lVar3;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> iStack_48;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_40;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_38 [8]
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  __new_size = this->content_length_;
  if (0 < (long)__new_size) {
    pcVar2 = (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar2;
    if ((long)__new_size < lVar3) {
      std::vector<char,_std::allocator<char>_>::resize(&this->post_,__new_size);
      pcVar2 = (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = (long)(this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar2;
    }
    peVar1 = (this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
              (local_38,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
    mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
              ((offset_in_cgi_forwarder_to_subr)&iStack_48,
               (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)on_post_data_read);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    intrusive_ptr(&local_40,&iStack_48);
    (*peVar1->_vptr_connection[0x11])(peVar1,pcVar2,lVar3,&local_40);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_40);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&iStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    return;
  }
  std::_Vector_base<char,_std::allocator<char>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->response_,(_Vector_impl_data *)&this->post_);
  std::vector<char,_std::allocator<char>_>::resize(&this->response_,0x2000);
  read_response(this);
  return;
}

Assistant:

void write_post()
		{
			if(content_length_ > 0) {
				if(content_length_ <  (long long)(post_.size())) {
					post_.resize(content_length_);
				}
				conn_->async_read_some(&post_.front(),post_.size(),
					mfunc_to_io_handler(&cgi_forwarder::on_post_data_read,shared_from_this()));
			}
			else {
				response_.swap(post_);
				response_.resize(8192);
				read_response();
			}
		}